

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

Value * __thiscall json::Value::setObject(Value *this)

{
  ObjectStorage *pOVar1;
  void *in_RSI;
  
  free(this,in_RSI);
  this->type = Object;
  pOVar1 = (ObjectStorage *)operator_new(0x38);
  (pOVar1->_M_h)._M_buckets = (__buckets_ptr)0x0;
  (pOVar1->_M_h)._M_bucket_count = 0;
  *(undefined8 *)&(pOVar1->_M_h)._M_rehash_policy = 0;
  (pOVar1->_M_h)._M_rehash_policy._M_next_resize = 0;
  (pOVar1->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pOVar1->_M_h)._M_element_count = 0;
  (pOVar1->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  (pOVar1->_M_h)._M_buckets = &(pOVar1->_M_h)._M_single_bucket;
  (pOVar1->_M_h)._M_bucket_count = 1;
  (pOVar1->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (pOVar1->_M_h)._M_rehash_policy._M_next_resize = 0;
  (pOVar1->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  (this->field_1).obj = pOVar1;
  return this;
}

Assistant:

Value& setObject() {
    free();
    type = Object;
    obj = new ObjectStorage();
    return *this;
  }